

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementDocument.cpp
# Opt level: O0

void Rml::anon_unknown_0::SearchNavigationTarget
               (SearchNavigationResult *best_result,Element *element,
               NavigationSearchDirection direction,BoundingBox *bounding_box,
               Element *exclude_element)

{
  bool bVar1;
  int iVar2;
  CanFocus CVar3;
  int iVar4;
  Element *element_00;
  Box *this;
  Vector2f rhs;
  int heuristic;
  Vector2<float> local_64;
  undefined1 local_5c [8];
  BoundingBox target_box;
  Vector2f position;
  CanFocus can_focus;
  Element *child;
  int child_index;
  int num_children;
  Element *exclude_element_local;
  BoundingBox *bounding_box_local;
  NavigationSearchDirection direction_local;
  Element *element_local;
  SearchNavigationResult *best_result_local;
  
  iVar2 = Element::GetNumChildren(element,false);
  child._0_4_ = 0;
  do {
    if (iVar2 <= (int)child) {
      return;
    }
    element_00 = Element::GetChild(element,(int)child);
    if (element_00 != exclude_element) {
      CVar3 = CanFocusElement(element_00);
      if (CVar3 == Yes) {
        target_box.max = Element::GetAbsoluteOffset(element_00,Border);
        this = Element::GetBox(element_00);
        rhs = Box::GetSize(this,Border);
        local_64 = Vector2<float>::operator+(&target_box.max,rhs);
        BoundingBox::BoundingBox((BoundingBox *)local_5c,&target_box.max,&local_64);
        iVar4 = GetNavigationHeuristic(bounding_box,(BoundingBox *)local_5c,direction);
        if (iVar4 < best_result->heuristic) {
          best_result->element = element_00;
          best_result->heuristic = iVar4;
        }
      }
      else if ((CVar3 == NoAndNoChildren) || (bVar1 = IsScrollContainer(element_00), bVar1))
      goto LAB_0057a2db;
      SearchNavigationTarget(best_result,element_00,direction,bounding_box,exclude_element);
    }
LAB_0057a2db:
    child._0_4_ = (int)child + 1;
  } while( true );
}

Assistant:

void SearchNavigationTarget(SearchNavigationResult& best_result, Element* element, NavigationSearchDirection direction,
		const BoundingBox& bounding_box, Element* exclude_element)
	{
		const int num_children = element->GetNumChildren();
		for (int child_index = 0; child_index < num_children; child_index++)
		{
			Element* child = element->GetChild(child_index);
			if (child == exclude_element)
				continue;

			const CanFocus can_focus = CanFocusElement(child);
			if (can_focus == CanFocus::Yes)
			{
				const Vector2f position = child->GetAbsoluteOffset(BoxArea::Border);
				const BoundingBox target_box = {position, position + child->GetBox().GetSize(BoxArea::Border)};

				const int heuristic = GetNavigationHeuristic(bounding_box, target_box, direction);
				if (heuristic < best_result.heuristic)
				{
					best_result.element = child;
					best_result.heuristic = heuristic;
				}
			}
			else if (can_focus == CanFocus::NoAndNoChildren || IsScrollContainer(child))
			{
				continue;
			}

			SearchNavigationTarget(best_result, child, direction, bounding_box, exclude_element);
		}
	}